

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.h
# Opt level: O1

int __thiscall
Nova::Boundary_Uniform<float,_1>::Boundary_Side
          (Boundary_Uniform<float,_1> *this,int side,Range<int,_1> *region)

{
  int iVar1;
  
  if ((side & 1U) == 0) {
    if (2 < (side | 1U)) {
LAB_0011ab41:
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(side / 2),1,
                 (ulong)(uint)(side / 2));
    }
    region = (Range<int,_1> *)&region->max_corner;
    iVar1 = 1;
  }
  else {
    iVar1 = -1;
    if (2 < side + 1U) goto LAB_0011ab41;
  }
  return iVar1 + (region->min_corner)._data._M_elems[0];
}

Assistant:

int Boundary_Side(const int side,const Range<int,d>& region) const
    {int axis=side/2;return (side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;}